

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportedUgrid.hpp
# Opt level: O2

void __thiscall
Parfait::ImportedUgrid::ImportedUgrid
          (ImportedUgrid *this,vector<double,_std::allocator<double>_> *nodes_in,
          vector<int,_std::allocator<int>_> *triangles_in,
          vector<int,_std::allocator<int>_> *quads_in,vector<int,_std::allocator<int>_> *tets_in,
          vector<int,_std::allocator<int>_> *pyramids_in,vector<int,_std::allocator<int>_> prisms_in
          ,vector<int,_std::allocator<int>_> hexs_in,
          vector<int,_std::allocator<int>_> triangleTags_in,
          vector<int,_std::allocator<int>_> quadTags_in)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  ulong uVar3;
  int local_6c;
  vector<int,_std::allocator<int>_> *local_68;
  vector<int,_std::allocator<int>_> *local_60;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  std::vector<double,_std::allocator<double>_>::vector(&this->nodes,nodes_in);
  pvVar1 = &this->cellMap;
  local_68 = &this->faceMap;
  local_38 = &this->triangles;
  (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(local_38,triangles_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->quads,quads_in);
  local_40 = &this->quads;
  std::vector<int,_std::allocator<int>_>::vector(&this->tets,tets_in);
  local_48 = &this->tets;
  std::vector<int,_std::allocator<int>_>::vector(&this->pyramids,pyramids_in);
  local_50 = &this->pyramids;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->prisms,
             (vector<int,_std::allocator<int>_> *)
             prisms_in.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start);
  local_60 = &this->hexs;
  local_58 = &this->prisms;
  std::vector<int,_std::allocator<int>_>::vector
            (local_60,(vector<int,_std::allocator<int>_> *)
                      prisms_in.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::vector
            (&this->triangleTags,
             (vector<int,_std::allocator<int>_> *)
             prisms_in.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            (&this->quadTags,
             (vector<int,_std::allocator<int>_> *)
             hexs_in.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  (this->associated_component_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->associated_component_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->associated_component_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = (ulong)((long)(this->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  this->nnodes = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 3);
  uVar3 = (ulong)((long)(this->tets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->tets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  local_6c = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 4);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,&local_6c);
  uVar3 = (ulong)((long)(this->pyramids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->pyramids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  local_6c = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 5) +
             (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,&local_6c);
  uVar3 = (ulong)((long)(this->prisms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->prisms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  local_6c = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 6) +
             (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,&local_6c);
  uVar3 = (ulong)((long)(this->hexs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->hexs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  local_6c = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 8) +
             (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,&local_6c);
  pvVar1 = local_68;
  uVar3 = (ulong)((long)(this->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  local_6c = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 3);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_68,&local_6c);
  uVar3 = (ulong)((long)(this->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  local_6c = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 4) +
             (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,&local_6c);
  piVar2 = (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this->ncells = (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1];
  this->nfaces = piVar2[-1];
  return;
}

Assistant:

inline Parfait::ImportedUgrid::ImportedUgrid(std::vector<double> nodes_in,
																						 std::vector<int> triangles_in,
																						 std::vector<int> quads_in,
																						 std::vector<int> tets_in,
																						 std::vector<int> pyramids_in, 
																						 std::vector<int> prisms_in,
																						 std::vector<int> hexs_in, 
																						 std::vector<int> triangleTags_in, 
																						 std::vector<int> quadTags_in)
	: nodes(nodes_in),
	triangles(triangles_in),
	quads(quads_in),
	tets(tets_in),
	pyramids(pyramids_in),
	prisms(prisms_in),
	hexs(hexs_in),
    triangleTags(triangleTags_in),
    quadTags(quadTags_in)
{
	nnodes = (int)nodes.size()/3;
	cellMap.push_back((int)tets.size()/4);
	cellMap.push_back(cellMap.back() + (int)pyramids.size()/5);
	cellMap.push_back(cellMap.back() + (int)prisms.size()/6);
	cellMap.push_back(cellMap.back() + (int)hexs.size()/8);
	faceMap.push_back((int)triangles.size()/3);
	faceMap.push_back(faceMap.back() + (int)quads.size()/4);
	ncells = cellMap.back();
	nfaces = faceMap.back();
}